

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O2

LClosure * luaF_newLclosure(lua_State *L,int n)

{
  LClosure *pLVar1;
  long lVar2;
  
  pLVar1 = (LClosure *)luaC_newobj(L,6,(long)(n * 8 + 0x20));
  pLVar1->p = (Proto *)0x0;
  pLVar1->nupvalues = (lu_byte)n;
  for (lVar2 = (long)n + 3; lVar2 != 3; lVar2 = lVar2 + -1) {
    pLVar1->upvals[lVar2 + -4] = (UpVal *)0x0;
  }
  return pLVar1;
}

Assistant:

LClosure *luaF_newLclosure (lua_State *L, int nupvals) {
  GCObject *o = luaC_newobj(L, LUA_VLCL, sizeLclosure(nupvals));
  LClosure *c = gco2lcl(o);
  c->p = NULL;
  c->nupvalues = cast_byte(nupvals);
  while (nupvals--) c->upvals[nupvals] = NULL;
  return c;
}